

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPathCommand::InitialPass
          (cmFindPathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *__lhs;
  cmMakefile *this_00;
  int iVar1;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar1 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand._vptr_cmCommand[7])
                    (this,argsIn);
  if (SUB41(iVar1,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x222 + PATH,false);
      }
    }
    else {
      FindHeader_abi_cxx11_(&local_40,this);
      __lhs = &(this->super_cmFindBase).VariableName;
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      if (local_40._M_string_length == 0) {
        std::operator+(&local_60,__lhs,"-NOTFOUND");
        cmMakefile::AddCacheDefinition
                  (this_00,__lhs,local_60._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x222 + PATH,false);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        cmMakefile::AddCacheDefinition
                  (this_00,__lhs,local_40._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x222 + PATH,false);
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool cmFindPathCommand::InitialPass(std::vector<std::string> const& argsIn,
                                    cmExecutionStatus&)
{
  this->VariableDocumentation = "Path to a file.";
  this->CMakePathName = "INCLUDE";
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  if (this->AlreadyInCache) {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->AlreadyInCacheWithoutMetaInfo) {
      this->Makefile->AddCacheDefinition(
        this->VariableName, "", this->VariableDocumentation.c_str(),
        (this->IncludeFileInPath ? cmStateEnums::FILEPATH
                                 : cmStateEnums::PATH));
    }
    return true;
  }

  std::string result = this->FindHeader();
  if (!result.empty()) {
    this->Makefile->AddCacheDefinition(
      this->VariableName, result.c_str(), this->VariableDocumentation.c_str(),
      (this->IncludeFileInPath) ? cmStateEnums::FILEPATH : cmStateEnums::PATH);
    return true;
  }
  this->Makefile->AddCacheDefinition(
    this->VariableName, (this->VariableName + "-NOTFOUND").c_str(),
    this->VariableDocumentation.c_str(),
    (this->IncludeFileInPath) ? cmStateEnums::FILEPATH : cmStateEnums::PATH);
  return true;
}